

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O3

void __thiscall CLParam<bool>::Print(CLParam<bool> *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"# ");
  poVar1 = std::operator<<(poVar1,(string *)(this + 0x30));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"# [Default = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)this[0x51]);
  poVar1 = std::operator<<(poVar1,"]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  PrintSimple(this);
  return;
}

Assistant:

void Print()
    {
        std::cout << "# " << description << std::endl ;
        std::cout << "# [Default = " << default_value << "]" << std::endl;
        PrintSimple() ;
    }